

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::nextNode
          (DOMNodeIteratorImpl *this,DOMNode *node,bool visitChildren)

{
  int iVar1;
  uint uVar2;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  bool bVar3;
  MemoryManager *local_78;
  DOMDocumentImpl *local_68;
  DOMNode *local_48;
  DOMNode *parent;
  DOMNode *result;
  bool visitChildren_local;
  DOMNode *node_local;
  DOMNodeIteratorImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      local_78 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      if (this->fDocument == (DOMDocument *)0x0) {
        local_68 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_68 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
      }
      local_78 = DOMDocumentImpl::getMemoryManager(local_68);
    }
    DOMException::DOMException(this_00,0xb,0,local_78);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (node == (DOMNode *)0x0) {
    this_local = (DOMNodeIteratorImpl *)this->fRoot;
  }
  else if ((visitChildren) &&
          ((((this->fExpandEntityReferences & 1U) != 0 ||
            (iVar1 = (*node->_vptr_DOMNode[4])(), iVar1 != 5)) &&
           (uVar2 = (*node->_vptr_DOMNode[0x12])(), (uVar2 & 1) != 0)))) {
    iVar1 = (*node->_vptr_DOMNode[7])();
    this_local = (DOMNodeIteratorImpl *)CONCAT44(extraout_var,iVar1);
  }
  else if (node == this->fRoot) {
LAB_003055b4:
    this_local = (DOMNodeIteratorImpl *)0x0;
  }
  else {
    iVar1 = (*node->_vptr_DOMNode[10])();
    this_local = (DOMNodeIteratorImpl *)CONCAT44(extraout_var_00,iVar1);
    if (this_local == (DOMNodeIteratorImpl *)0x0) {
      iVar1 = (*node->_vptr_DOMNode[5])();
      local_48 = (DOMNode *)CONCAT44(extraout_var_01,iVar1);
      while( true ) {
        bVar3 = false;
        if (local_48 != (DOMNode *)0x0) {
          bVar3 = local_48 != this->fRoot;
        }
        if (!bVar3) goto LAB_003055b4;
        iVar1 = (*local_48->_vptr_DOMNode[10])();
        this_local = (DOMNodeIteratorImpl *)CONCAT44(extraout_var_02,iVar1);
        if (this_local != (DOMNodeIteratorImpl *)0x0) break;
        iVar1 = (*local_48->_vptr_DOMNode[5])();
        local_48 = (DOMNode *)CONCAT44(extraout_var_03,iVar1);
      }
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::nextNode (DOMNode* node, bool visitChildren) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    if (!node) return fRoot;

    DOMNode* result = 0;
    // only check children if we visit children.
    if (visitChildren) {
        //if hasChildren, return 1st child.
        if ((fExpandEntityReferences || node->getNodeType()!=DOMNode::ENTITY_REFERENCE_NODE) &&
            node->hasChildNodes()) {
            result = node->getFirstChild();
            return result;
        }
    }

    // if hasSibling, return sibling
    if (node != fRoot) {
        result = node->getNextSibling();
        if (result != 0) return result;


        // return parent's 1st sibling.
        DOMNode* parent = node->getParentNode();
        while ((parent != 0) && parent != fRoot) {
            result = parent->getNextSibling();
            if (result != 0) {
                return result;
            } else {
                parent = parent->getParentNode();
            }

        } // while (parent != 0 && parent != fRoot) {
    }
    // end of list, return 0
    return 0;
}